

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O2

void btokSMStart(void *state,octet *key)

{
  octet *level;
  void *state_00;
  
  level = (octet *)((long)state + 0x40);
  memSet(level,'\0',0x10);
  state_00 = (void *)((long)state + 0x50);
  beltKRPStart(state_00,key,0x20,level);
  *(undefined1 *)((long)state + 0x40) = 1;
  beltKRPStepG((octet *)state,0x20,level,state_00);
  *(undefined1 *)((long)state + 0x40) = 2;
  beltKRPStepG((octet *)((long)state + 0x20),0x20,level,state_00);
  *(undefined1 *)((long)state + 0x40) = 0;
  return;
}

Assistant:

void btokSMStart(void* state, const octet key[32])
{
	btok_sm_st* st = (btok_sm_st*)state;
	// pre
	ASSERT(memIsDisjoint2(key, 32, state, btokSM_keep()));
	// key_i <- belt-keyrep(key, 0, <i>, 32);
	memSetZero(st->ctr, 16);
	beltKRPStart(st->stack, key, 32, st->ctr);
	st->ctr[0] = 1;
	beltKRPStepG(st->key1, 32, st->ctr, st->stack);
	st->ctr[0] = 2;
	beltKRPStepG(st->key2, 32, st->ctr, st->stack);
	// ctr <- 0
	st->ctr[0] = 0;
}